

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_dimensionstyle.cpp
# Opt level: O2

bool __thiscall ON_DimStyle::Write(ON_DimStyle *this,ON_BinaryArchive *file)

{
  LengthUnitSystem LVar1;
  bool bVar2;
  V5_TextDisplayMode VVar3;
  LengthUnitSystem LVar4;
  LengthUnitSystem LVar5;
  V5_vertical_alignment VVar6;
  V5_horizontal_alignment VVar7;
  int iVar8;
  field field_id;
  ON__UINT32 OVar9;
  ON_UUID *uuid;
  uint i;
  uint uVar10;
  double x;
  bool local_49;
  ON_SimpleArray<bool> overrides;
  
  bVar2 = ON_BinaryArchive::BeginWrite3dmChunk(file,0x40008000,1,9);
  if (!bVar2) {
    return false;
  }
  bVar2 = ON_BinaryArchive::WriteModelComponentAttributes(file,&this->super_ON_ModelComponent,0x78);
  if ((((bVar2) && (bVar2 = ON_BinaryArchive::WriteDouble(file,this->m_extextension), bVar2)) &&
      (bVar2 = ON_BinaryArchive::WriteDouble(file,this->m_extoffset), bVar2)) &&
     (((bVar2 = ON_BinaryArchive::WriteDouble(file,this->m_arrowsize), bVar2 &&
       (bVar2 = ON_BinaryArchive::WriteDouble(file,this->m_leaderarrowsize), bVar2)) &&
      ((bVar2 = ON_BinaryArchive::WriteDouble(file,this->m_centermark), bVar2 &&
       ((bVar2 = ON_BinaryArchive::WriteDouble(file,this->m_textgap), bVar2 &&
        (bVar2 = ON_BinaryArchive::WriteDouble(file,this->m_textheight), bVar2)))))))) {
    VVar3 = ON_INTERNAL_OBSOLETE::V5TextDisplayModeFromV6DimStyle(this);
    bVar2 = ON_BinaryArchive::WriteInt(file,(uint)VVar3);
    if ((bVar2) && (bVar2 = ON_BinaryArchive::WriteInt(file,(uint)this->m_angleformat), bVar2)) {
      uVar10 = 0;
      LVar4 = DimensionLengthDisplayUnit(this,0);
      LVar5 = AlternateDimensionLengthDisplayUnit(this,0);
      OVar9 = (ON__UINT32)(LVar4 == Inches && this->m_dimension_length_display == InchesFractional);
      if (this->m_dimension_length_display == FeetAndInches) {
        OVar9 = 2;
      }
      bVar2 = ON_BinaryArchive::WriteInt(file,OVar9);
      if (!bVar2) goto LAB_004748ad;
      bVar2 = ON_BinaryArchive::WriteInt(file,this->m_angleresolution);
      if ((bVar2) && (bVar2 = ON_BinaryArchive::WriteInt(file,this->m_lengthresolution), bVar2)) {
        iVar8 = ON_BinaryArchive::Archive3dmVersion(file);
        if (iVar8 < 0x3c) {
          iVar8 = ON_ModelComponent::Index(&this->super_ON_ModelComponent);
          bVar2 = ON_BinaryArchive::Write3dmReferencedComponentIndex(file,TextStyle,iVar8);
        }
        else {
          bVar2 = ON_BinaryArchive::WriteInt(file,-0x7fffffff);
        }
        if ((((bVar2 != false) &&
             (bVar2 = ON_BinaryArchive::WriteDouble(file,this->m_lengthfactor), bVar2)) &&
            (bVar2 = ON_BinaryArchive::WriteBool(file,this->m_bAlternate), bVar2)) &&
           (bVar2 = ON_BinaryArchive::WriteDouble(file,this->m_alternate_lengthfactor), bVar2)) {
          OVar9 = (ON__UINT32)
                  (LVar5 == Inches && this->m_alternate_dimension_length_display == InchesFractional
                  );
          if (this->m_alternate_dimension_length_display == FeetAndInches) {
            OVar9 = 2;
          }
          bVar2 = ON_BinaryArchive::WriteInt(file,OVar9);
          if ((bVar2) &&
             (bVar2 = ON_BinaryArchive::WriteInt(file,this->m_alternate_lengthresolution), bVar2)) {
            ON_wString::IsValid(&this->m_prefix,true);
            bVar2 = ON_BinaryArchive::WriteString(file,&this->m_prefix);
            if (bVar2) {
              ON_wString::IsValid(&this->m_suffix,true);
              bVar2 = ON_BinaryArchive::WriteString(file,&this->m_suffix);
              if (bVar2) {
                ON_wString::IsValid(&this->m_alternate_prefix,true);
                bVar2 = ON_BinaryArchive::WriteString(file,&this->m_alternate_prefix);
                if (bVar2) {
                  ON_wString::IsValid(&this->m_alternate_suffix,true);
                  bVar2 = ON_BinaryArchive::WriteString(file,&this->m_alternate_suffix);
                  if (((bVar2) &&
                      (bVar2 = ON_BinaryArchive::WriteDouble(file,this->m_dimextension), bVar2)) &&
                     ((bVar2 = ON_BinaryArchive::WriteBool(file,this->m_bSuppressExtension1), bVar2
                      && (bVar2 = ON_BinaryArchive::WriteBool(file,this->m_bSuppressExtension2),
                         bVar2)))) {
                    uuid = ON_ModelComponent::ParentId(&this->super_ON_ModelComponent);
                    bVar2 = ON_BinaryArchive::WriteUuid(file,uuid);
                    if ((bVar2) &&
                       (bVar2 = ON_BinaryArchive::WriteInt(file,this->m_field_override_parent_count)
                       , bVar2)) {
                      OVar9 = this->m_field_override_parent_count;
                      bVar2 = ON_BinaryArchive::WriteBool(file,OVar9 != 0);
                      if (bVar2) {
                        if (OVar9 != 0) {
                          ON_SimpleArray<bool>::ON_SimpleArray(&overrides,0x73);
                          for (uVar10 = 0; uVar10 != 0x73; uVar10 = uVar10 + 1) {
                            field_id = FieldFromUnsigned(uVar10);
                            local_49 = IsFieldOverride(this,field_id);
                            ON_SimpleArray<bool>::Append(&overrides,&local_49);
                          }
                          bVar2 = ON_BinaryArchive::WriteArray(file,&overrides);
                          ON_SimpleArray<bool>::~ON_SimpleArray(&overrides);
                          if (!bVar2) goto LAB_004748aa;
                        }
                        bVar2 = ON_BinaryArchive::WriteInt(file,(uint)this->m_tolerance_format);
                        if ((((bVar2) &&
                             (bVar2 = ON_BinaryArchive::WriteInt(file,this->m_tolerance_resolution),
                             bVar2)) &&
                            (bVar2 = ON_BinaryArchive::WriteDouble
                                               (file,this->m_tolerance_upper_value), bVar2)) &&
                           (((bVar2 = ON_BinaryArchive::WriteDouble
                                                (file,this->m_tolerance_lower_value), bVar2 &&
                             (bVar2 = ON_BinaryArchive::WriteDouble
                                                (file,this->m_tolerance_height_scale), bVar2)) &&
                            ((bVar2 = ON_BinaryArchive::WriteDouble(file,this->m_baseline_spacing),
                             bVar2 && ((bVar2 = ON_BinaryArchive::WriteBool
                                                          (file,(this->m_text_mask).m_bDrawMask),
                                       bVar2 && (bVar2 = ON_BinaryArchive::WriteInt
                                                                   (file,(uint)(this->m_text_mask).
                                                                               m_mask_type), bVar2))
                                      )))))) {
                          overrides._vptr_ON_SimpleArray._0_4_ =
                               (this->m_text_mask).m_mask_color.field_0;
                          bVar2 = ON_BinaryArchive::WriteColor(file,(ON_Color *)&overrides);
                          if (bVar2) {
                            x = ON_ScaleValue::RightToLeftScale(&this->m_scale_value);
                            bVar2 = ON_BinaryArchive::WriteDouble(file,x);
                            if ((((((((bVar2) &&
                                     (bVar2 = ON_BinaryArchive::WriteInt
                                                        (file,this->m_dimscale_source), bVar2)) &&
                                    (bVar2 = ON_BinaryArchive::WriteUuid
                                                       (file,&this->m_source_dimstyle), bVar2)) &&
                                   ((bVar2 = ON_BinaryArchive::WriteChar
                                                       (file,this->m_ext_line_color_source), bVar2
                                    && (bVar2 = ON_BinaryArchive::WriteChar
                                                          (file,this->m_dim_line_color_source),
                                       bVar2)))) &&
                                  ((bVar2 = ON_BinaryArchive::WriteChar
                                                      (file,this->m_arrow_color_source), bVar2 &&
                                   ((bVar2 = ON_BinaryArchive::WriteChar
                                                       (file,this->m_text_color_source), bVar2 &&
                                    (bVar2 = ON_BinaryArchive::WriteColor
                                                       (file,&this->m_ext_line_color), bVar2))))))
                                 && (bVar2 = ON_BinaryArchive::WriteColor
                                                       (file,&this->m_dim_line_color), bVar2)) &&
                                (((((((((bVar2 = ON_BinaryArchive::WriteColor
                                                           (file,&this->m_arrow_color), bVar2 &&
                                        (bVar2 = ON_BinaryArchive::WriteColor
                                                           (file,&this->m_text_color), bVar2)) &&
                                       (bVar2 = ON_BinaryArchive::WriteChar
                                                          (file,this->m_ext_line_plot_color_source),
                                       bVar2)) &&
                                      ((bVar2 = ON_BinaryArchive::WriteChar
                                                          (file,this->m_dim_line_plot_color_source),
                                       bVar2 && (bVar2 = ON_BinaryArchive::WriteChar
                                                                   (file,this->
                                                  m_arrow_plot_color_source), bVar2)))) &&
                                     (bVar2 = ON_BinaryArchive::WriteChar
                                                        (file,this->m_text_plot_color_source), bVar2
                                     )) && ((bVar2 = ON_BinaryArchive::WriteColor
                                                               (file,&this->m_ext_line_plot_color),
                                            bVar2 && (bVar2 = ON_BinaryArchive::WriteColor
                                                                        (file,&this->
                                                  m_dim_line_plot_color), bVar2)))) &&
                                   ((bVar2 = ON_BinaryArchive::WriteColor
                                                       (file,&this->m_arrow_plot_color), bVar2 &&
                                    (((bVar2 = ON_BinaryArchive::WriteColor
                                                         (file,&this->m_text_plot_color), bVar2 &&
                                      (bVar2 = ON_BinaryArchive::WriteChar
                                                         (file,this->m_ext_line_plot_weight_source),
                                      bVar2)) &&
                                     (bVar2 = ON_BinaryArchive::WriteChar
                                                        (file,this->m_dim_line_plot_weight_source),
                                     bVar2)))))) &&
                                  ((((bVar2 = ON_BinaryArchive::WriteDouble
                                                        (file,this->m_ext_line_plot_weight_mm),
                                     bVar2 && (bVar2 = ON_BinaryArchive::WriteDouble
                                                                 (file,this->
                                                  m_dim_line_plot_weight_mm), bVar2)) &&
                                    (bVar2 = ON_BinaryArchive::WriteDouble
                                                       (file,this->m_fixed_extension_len), bVar2))
                                   && ((bVar2 = ON_BinaryArchive::WriteBool
                                                          (file,this->m_fixed_extension_len_on),
                                       bVar2 && (bVar2 = ON_BinaryArchive::WriteDouble
                                                                   (file,this->m_text_rotation),
                                                bVar2)))))) &&
                                 (((bVar2 = ON_BinaryArchive::WriteInt
                                                      (file,this->m_alternate_tolerance_resolution),
                                   bVar2 && (((bVar2 = ON_BinaryArchive::WriteDouble
                                                                 (file,this->
                                                  m_tol_textheight_fraction), bVar2 &&
                                              (bVar2 = ON_BinaryArchive::WriteBool
                                                                 (file,this->m_suppress_arrow1),
                                              bVar2)) &&
                                             (bVar2 = ON_BinaryArchive::WriteBool
                                                                (file,this->m_suppress_arrow2),
                                             bVar2)))) &&
                                  ((bVar2 = ON_BinaryArchive::WriteInt(file,this->m_textmove_leader)
                                   , bVar2 &&
                                   (bVar2 = ON_BinaryArchive::WriteInt(file,this->m_arclength_sym),
                                   bVar2)))))))) &&
                               ((bVar2 = ON_BinaryArchive::WriteDouble
                                                   (file,this->m_stack_textheight_fraction), bVar2
                                && (((bVar2 = ON_BinaryArchive::WriteInt
                                                        (file,(uint)this->m_stack_format), bVar2 &&
                                     (bVar2 = ON_BinaryArchive::WriteDouble(file,this->m_alt_round),
                                     bVar2)) &&
                                    ((bVar2 = ON_BinaryArchive::WriteDouble(file,this->m_round),
                                     bVar2 && ((bVar2 = ON_BinaryArchive::WriteDouble
                                                                  (file,this->m_angular_round),
                                               bVar2 && (bVar2 = ON_BinaryArchive::WriteInt
                                                                           (file,(uint)this->
                                                  m_alt_zero_suppress), bVar2)))))))))) {
                              uVar10 = 0;
                              bVar2 = ON_BinaryArchive::WriteInt(file,0);
                              if (!bVar2) goto LAB_004748ad;
                              bVar2 = ON_BinaryArchive::WriteInt(file,(uint)this->m_zero_suppress);
                              if ((((((bVar2) &&
                                     (bVar2 = ON_BinaryArchive::WriteInt
                                                        (file,(uint)this->m_ang_zero_suppress),
                                     bVar2)) &&
                                    (bVar2 = ON_BinaryArchive::WriteBool(file,this->m_alt_below),
                                    bVar2)) &&
                                   ((bVar2 = ON_BinaryArchive::WriteInt(file,this->m_arrow_type_1),
                                    bVar2 && (bVar2 = ON_BinaryArchive::WriteInt
                                                                (file,this->m_arrow_type_2), bVar2))
                                   )) && ((bVar2 = ON_BinaryArchive::WriteInt
                                                             (file,this->m_leader_arrow_type), bVar2
                                          && ((bVar2 = ON_BinaryArchive::WriteUuid
                                                                 (file,&this->m_arrow_block_id_1),
                                              bVar2 && (bVar2 = ON_BinaryArchive::WriteUuid
                                                                          (file,&this->
                                                  m_arrow_block_id_2), bVar2)))))) &&
                                 ((bVar2 = ON_BinaryArchive::WriteUuid
                                                     (file,&this->m_leader_arrow_block_id), bVar2 &&
                                  (bVar2 = ON_BinaryArchive::WriteInt(file,1), bVar2)))) {
                                VVar6 = ON_INTERNAL_OBSOLETE::
                                        V5VerticalAlignmentFromV6VerticalAlignment
                                                  (this->m_text_vertical_alignment);
                                bVar2 = ON_BinaryArchive::WriteInt(file,(uint)VVar6);
                                if (bVar2) {
                                  VVar6 = ON_INTERNAL_OBSOLETE::
                                          V5VerticalAlignmentFromV6VerticalAlignment
                                                    (this->m_leader_text_vertical_alignment);
                                  bVar2 = ON_BinaryArchive::WriteInt(file,(uint)VVar6);
                                  if ((((bVar2) &&
                                       (bVar2 = ON_BinaryArchive::WriteInt
                                                          (file,(uint)this->
                                                  m_leader_content_angle_style), bVar2)) &&
                                      (bVar2 = ON_BinaryArchive::WriteInt
                                                         (file,(uint)this->m_leader_curve_type),
                                      bVar2)) &&
                                     (((bVar2 = ON_BinaryArchive::WriteDouble
                                                          (file,this->m_leader_content_angle), bVar2
                                       && (bVar2 = ON_BinaryArchive::WriteBool
                                                             (file,this->m_leader_has_landing),
                                          bVar2)) &&
                                      (bVar2 = ON_BinaryArchive::WriteDouble
                                                         (file,this->m_leader_landing_length), bVar2
                                      )))) {
                                    VVar7 = ON_INTERNAL_OBSOLETE::
                                            V5HorizontalAlignmentFromV6HorizontalAlignment
                                                      (this->m_text_horizontal_alignment);
                                    bVar2 = ON_BinaryArchive::WriteInt(file,(uint)VVar7);
                                    if (bVar2) {
                                      VVar7 = ON_INTERNAL_OBSOLETE::
                                              V5HorizontalAlignmentFromV6HorizontalAlignment
                                                        (this->m_leader_text_horizontal_alignment);
                                      bVar2 = ON_BinaryArchive::WriteInt(file,(uint)VVar7);
                                      if (((bVar2) &&
                                          (bVar2 = ON_BinaryArchive::WriteBool
                                                             (file,this->m_draw_forward), bVar2)) &&
                                         (bVar2 = ON_BinaryArchive::WriteBool
                                                            (file,this->m_signed_ordinate), bVar2))
                                      {
                                        bVar2 = ON_ScaleValue::Write(&this->m_scale_value,file);
                                        uVar10 = 0;
                                        if (!bVar2) goto LAB_004748ad;
                                        LVar1 = this->m_dimstyle_unitsystem;
                                        OVar9 = 0;
                                        if ((LVar1 != CustomUnits) &&
                                           (OVar9 = uVar10, LVar1 != Unset)) {
                                          OVar9 = (ON__UINT32)LVar1;
                                        }
                                        bVar2 = ON_BinaryArchive::WriteInt(file,OVar9);
                                        if (((((bVar2) &&
                                              (bVar2 = ON_Font::Write(&this->m_font_characteristics,
                                                                      file), bVar2)) &&
                                             (bVar2 = ON_TextMask::Write(&this->m_text_mask,file),
                                             bVar2)) &&
                                            (((bVar2 = ON_BinaryArchive::WriteInt
                                                                 (file,(uint)this->
                                                  m_dim_text_location), bVar2 &&
                                              (bVar2 = ON_BinaryArchive::WriteInt
                                                                 (file,(uint)this->
                                                  m_dimradial_text_location), bVar2)) &&
                                             (((((bVar2 = ON_BinaryArchive::WriteInt
                                                                    (file,(uint)this->
                                                  m_text_vertical_alignment), bVar2 &&
                                                 ((bVar2 = ON_BinaryArchive::WriteInt
                                                                     (file,(uint)this->
                                                  m_text_horizontal_alignment), bVar2 &&
                                                  (bVar2 = ON_BinaryArchive::WriteInt
                                                                     (file,(uint)this->
                                                  m_leader_text_vertical_alignment), bVar2)))) &&
                                                ((bVar2 = ON_BinaryArchive::WriteInt
                                                                    (file,(uint)this->
                                                  m_leader_text_horizontal_alignment), bVar2 &&
                                                 ((((bVar2 = ON_BinaryArchive::WriteInt
                                                                       (file,(uint)this->
                                                  m_text_orientation), bVar2 &&
                                                  (bVar2 = ON_BinaryArchive::WriteInt
                                                                     (file,(uint)this->
                                                  m_leader_text_orientation), bVar2)) &&
                                                  (bVar2 = ON_BinaryArchive::WriteInt
                                                                     (file,(uint)this->
                                                  m_dim_text_orientation), bVar2)) &&
                                                  ((bVar2 = ON_BinaryArchive::WriteInt
                                                                      (file,(uint)this->
                                                  m_dimradial_text_orientation), bVar2 &&
                                                  (bVar2 = ON_BinaryArchive::WriteInt
                                                                     (file,(uint)this->
                                                  m_dim_text_angle_style), bVar2)))))))) &&
                                               ((bVar2 = ON_BinaryArchive::WriteInt
                                                                   (file,(uint)this->
                                                  m_dimradial_text_angle_style), bVar2 &&
                                                ((bVar2 = ON_BinaryArchive::WriteBool
                                                                    (file,this->m_text_underlined),
                                                 bVar2 && (bVar2 = ON_BinaryArchive::WriteInt
                                                                             (file,(uint)LVar4),
                                                          bVar2)))))) &&
                                              (bVar2 = ON_BinaryArchive::WriteInt(file,(uint)LVar5),
                                              bVar2)))))) &&
                                           ((((bVar2 = ON_BinaryArchive::WriteInt
                                                                 (file,this->
                                                  m_dimension_length_display), bVar2 &&
                                              (bVar2 = ON_BinaryArchive::WriteInt
                                                                 (file,this->
                                                  m_alternate_dimension_length_display), bVar2)) &&
                                             (bVar2 = ON_BinaryArchive::WriteInt
                                                                (file,(uint)this->m_centermark_style
                                                                ), bVar2)) &&
                                            (((bVar2 = ON_BinaryArchive::WriteBool
                                                                 (file,this->m_bForceDimLine), bVar2
                                              && (bVar2 = ON_BinaryArchive::WriteInt
                                                                    (file,(uint)this->m_TextFit),
                                                 bVar2)) &&
                                             (bVar2 = ON_BinaryArchive::WriteInt
                                                                (file,(uint)this->m_ArrowFit), bVar2
                                             )))))) {
                                          bVar2 = ON_BinaryArchive::WriteInt
                                                            (file,this->m_decimal_separator);
                                          uVar10 = (uint)bVar2;
                                          goto LAB_004748ad;
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_004748aa:
  uVar10 = 0;
LAB_004748ad:
  bVar2 = ON_BinaryArchive::EndWrite3dmChunk(file);
  return (bool)(bVar2 & (byte)uVar10);
}

Assistant:

bool ON_DimStyle::Write(
  ON_BinaryArchive& file // serialize definition to binary archive
  ) const
{
  if (!file.BeginWrite3dmChunk(TCODE_ANONYMOUS_CHUNK, 1, 9))
    return false;

  bool rc = false;
  for (;;)
  {
    if (!file.WriteModelComponentAttributes(*this, ON_ModelComponent::Attributes::BinaryArchiveAttributes))
      break;

    unsigned int u;

    if (!file.WriteDouble(m_extextension)) break;
    if (!file.WriteDouble(m_extoffset)) break;
    if (!file.WriteDouble(m_arrowsize)) break;
    if (!file.WriteDouble(m_leaderarrowsize)) break;
    if (!file.WriteDouble(m_centermark)) break;
    if (!file.WriteDouble(m_textgap)) break;
    if (!file.WriteDouble(m_textheight)) break;


    ON_INTERNAL_OBSOLETE::V5_TextDisplayMode obsolete_dimstyle_textalign = ON_INTERNAL_OBSOLETE::V5TextDisplayModeFromV6DimStyle(*this);
    u = static_cast<unsigned int>(obsolete_dimstyle_textalign);
    if (!file.WriteInt(u)) break;

    u = static_cast<unsigned char>(m_angleformat);
    if (!file.WriteInt(u)) break;

    // do not pass in model_sn - we want ON::LengthUnitSystem::None from ON_DimStyle::LengthDisplay::ModelUnits.
    const ON::LengthUnitSystem dim_length_display_unit = DimensionLengthDisplayUnit(0);
    const ON::LengthUnitSystem alt_dim_length_display_unit = AlternateDimensionLengthDisplayUnit(0);

    // write obsolete ON_DimStyle::OBSOLETE_LengthForma enum value
    u = static_cast<unsigned char>(
      ON_DimStyle::OBSOLETE_LengthFormatFromLengthDisplay(
        DimensionLengthDisplay(),
        dim_length_display_unit
      )
      );
    if (!file.WriteInt(u)) break;

    if (!file.WriteInt(m_angleresolution)) break;
    if (!file.WriteInt(m_lengthresolution)) break;

    if (file.Archive3dmVersion() >= 60)
    {
      int ignored_text_style_index = ON_UNSET_INT_INDEX;
      if (!file.WriteInt(ignored_text_style_index))
        break;
    }
    else
    {
      // ON_ModelComponent::Type::TextStyle, Index() are not  mistakes.
      // The code in Write3dmReferencedComponentIndex() will convert the dim style index to an approprate
      // value tht depends on the version ofr 3dm archive (<= V5 or >= V6) being saved.
      if (!file.Write3dmReferencedComponentIndex(ON_ModelComponent::Type::TextStyle, Index())) break;
    }

    if (!file.WriteDouble(m_lengthfactor)) break;
    if (!file.WriteBool(m_bAlternate)) break;
    if (!file.WriteDouble(m_alternate_lengthfactor)) break;

    // write alternate obsolete ON_DimStyle::OBSOLETE_LengthForma enum value
    u = static_cast<unsigned char>(
      ON_DimStyle::OBSOLETE_LengthFormatFromLengthDisplay(
        AlternateDimensionLengthDisplay(),
        alt_dim_length_display_unit
      )
      );
    if (!file.WriteInt(u)) break;

    if (!file.WriteInt(m_alternate_lengthresolution)) break;

    // The ON_wString::IsValid calls prevent corrupt strings from breaking file IO
    m_prefix.IsValid(true);
    if (!file.WriteString(m_prefix)) break;

    m_suffix.IsValid(true);
    if (!file.WriteString(m_suffix)) break;

    m_alternate_prefix.IsValid(true);
    if (!file.WriteString(m_alternate_prefix)) break;

    m_alternate_suffix.IsValid(true);
    if (!file.WriteString(m_alternate_suffix)) break;

    if (!file.WriteDouble(m_dimextension)) break;
    if (!file.WriteBool(m_bSuppressExtension1)) break;
    if (!file.WriteBool(m_bSuppressExtension2)) break;

    if (!file.WriteUuid(ParentId())) break;

    unsigned int ignored_legacy_value = m_field_override_parent_count;
    if (!file.WriteInt(ignored_legacy_value)) break;

    bool bOverrides = (m_field_override_parent_count > 0);
    if (!file.WriteBool(bOverrides)) break;
    if (bOverrides)
    {
      const unsigned int count = static_cast<unsigned int>(ON_DimStyle::field::Count);
      ON_SimpleArray<bool> overrides(count);
      for (unsigned int i = 0; i < count; i++)
      {
        overrides.Append(this->IsFieldOverride(ON_DimStyle::FieldFromUnsigned(i)));
      }
      if (!file.WriteArray(overrides)) break;
    }

    u = static_cast<unsigned char>(m_tolerance_format);
    if (!file.WriteInt(u)) break;

    if (!file.WriteInt(m_tolerance_resolution)) break;
    if (!file.WriteDouble(m_tolerance_upper_value)) break;   // or both upper and lower in symmetrical style
    if (!file.WriteDouble(m_tolerance_lower_value)) break;
    if (!file.WriteDouble(m_tolerance_height_scale)) break;  // relative to the main dimension text

    if (!file.WriteDouble(m_baseline_spacing)) break;

    // The text mask settings used to be a collection of several member variables
    // on ON_DimStyle and are now in an ON_TextMask class and a m_text_mask on ON_DimStyle.
    // These values are written here so the file format is not broken and 
    // older versions of Rhino can read newer file.
    if (!file.WriteBool(DrawTextMask())) break;
    u = (unsigned int)(static_cast<unsigned char>(MaskFillType()));
    if (!file.WriteInt(u)) break;
    if (!file.WriteColor(MaskColor())) break;

    if (!file.WriteDouble( DimScale() )) break;
    if (!file.WriteInt(m_dimscale_source)) break;

    if (!file.WriteUuid(m_source_dimstyle)) break;
    if (!file.WriteChar(m_ext_line_color_source)) break;
    if (!file.WriteChar(m_dim_line_color_source)) break;
    if (!file.WriteChar(m_arrow_color_source)) break;
    if (!file.WriteChar(m_text_color_source)) break;
    if (!file.WriteColor(m_ext_line_color)) break;
    if (!file.WriteColor(m_dim_line_color)) break;
    if (!file.WriteColor(m_arrow_color)) break;
    if (!file.WriteColor(m_text_color)) break;
    if (!file.WriteChar(m_ext_line_plot_color_source)) break;
    if (!file.WriteChar(m_dim_line_plot_color_source)) break;
    if (!file.WriteChar(m_arrow_plot_color_source)) break;
    if (!file.WriteChar(m_text_plot_color_source)) break;
    if (!file.WriteColor(m_ext_line_plot_color)) break;
    if (!file.WriteColor(m_dim_line_plot_color)) break;
    if (!file.WriteColor(m_arrow_plot_color)) break;
    if (!file.WriteColor(m_text_plot_color)) break;
    if (!file.WriteChar(m_ext_line_plot_weight_source)) break;
    if (!file.WriteChar(m_dim_line_plot_weight_source)) break;
    if (!file.WriteDouble(m_ext_line_plot_weight_mm)) break;
    if (!file.WriteDouble(m_dim_line_plot_weight_mm)) break;

    if (!file.WriteDouble(m_fixed_extension_len)) break;
    if (!file.WriteBool(m_fixed_extension_len_on)) break;

    if (!file.WriteDouble(m_text_rotation)) break;
    if (!file.WriteInt(m_alternate_tolerance_resolution)) break;
    if (!file.WriteDouble(m_tol_textheight_fraction)) break;

    if (!file.WriteBool(m_suppress_arrow1)) break;
    if (!file.WriteBool(m_suppress_arrow2)) break;
    if (!file.WriteInt(m_textmove_leader)) break;
    if (!file.WriteInt(m_arclength_sym)) break;
    if (!file.WriteDouble(m_stack_textheight_fraction)) break;

    u = static_cast<unsigned char>(m_stack_format);
    if (!file.WriteInt(u)) break;
    if (!file.WriteDouble(m_alt_round)) break;
    if (!file.WriteDouble(m_round)) break;
    if (!file.WriteDouble(m_angular_round)) break;

    u = static_cast<unsigned char>(m_alt_zero_suppress);
    if (!file.WriteInt(u)) break;

    u = 0;// OBSOLETE; static_cast<unsigned char>(m_tol_zero_suppress);
    if (!file.WriteInt(u)) break;

    u = static_cast<unsigned char>(m_zero_suppress);
    if (!file.WriteInt(u)) break;
    u = static_cast<unsigned char>(m_ang_zero_suppress);
    if (!file.WriteInt(u)) break;


    if (!file.WriteBool(m_alt_below)) break;

    // true: display alternate text after main text
    u = static_cast<unsigned int>(m_arrow_type_1);
    if (!file.WriteInt(u)) break;
    u = static_cast<unsigned int>(m_arrow_type_2);
    if (!file.WriteInt(u)) break;
    u = static_cast<unsigned int>(m_leader_arrow_type);
    if (!file.WriteInt(u)) break;

    // Dale Lear April 8, 2016 
    //  working on http://mcneel.myjetbrains.com/youtrack/issue/RH-31796
    //
    //   It appears that when this code got changed from something that
    //   wrote 16 bytes to something that wrote 3 uuids, the chunk's
    //   minor version number was not increased and no provision was
    //   made to read files that had the the 16 bytes.
    //
    //   The file "layer_test.3dm" written by Windows Rhino WIP built on October 21, 2015
    //   is an example. See the comment in ON_DimStyle::Read() for more details
    //   and a fix that allows us to read the earlier files.
    //
    if (!file.WriteUuid(m_arrow_block_id_1)) break;
    if (!file.WriteUuid(m_arrow_block_id_2)) break;
    if (!file.WriteUuid(m_leader_arrow_block_id)) break;

    // End of version chunk 1.0 fields (in most cases - see comment above)

    // June 10, 2016
    // http://mcneel.myjetbrains.com/youtrack/issue/RH-33795
    // chunk version 1.1 information added

    // BEGIN chunk version 1.1 information

    u = 1; // OBSOLETE ON_DimStyle::leader_content_type::Text
    if (!file.WriteInt(u)) break;

    ON_INTERNAL_OBSOLETE::V5_vertical_alignment obsolete_text_valign = ON_INTERNAL_OBSOLETE::V5VerticalAlignmentFromV6VerticalAlignment(m_text_vertical_alignment);
    u = static_cast<unsigned int>(obsolete_text_valign);
    if (!file.WriteInt(u)) break;

    ON_INTERNAL_OBSOLETE::V5_vertical_alignment obsolete_leader_valign = ON_INTERNAL_OBSOLETE::V5VerticalAlignmentFromV6VerticalAlignment(m_leader_text_vertical_alignment);
    u = static_cast<unsigned int>(obsolete_leader_valign);
    if (!file.WriteInt(u)) break;


    u = static_cast<unsigned int>(m_leader_content_angle_style);
    if (!file.WriteInt(u)) break;

    u = static_cast<unsigned int>(m_leader_curve_type);
    if (!file.WriteInt(u)) break;

    if (!file.WriteDouble(m_leader_content_angle)) break;
    if (!file.WriteBool(m_leader_has_landing)) break;
    if (!file.WriteDouble(m_leader_landing_length)) break;

    ON_INTERNAL_OBSOLETE::V5_horizontal_alignment obsolete_text_halign = ON_INTERNAL_OBSOLETE::V5HorizontalAlignmentFromV6HorizontalAlignment(m_text_horizontal_alignment);
    u = static_cast<unsigned int>(obsolete_text_halign);
    if (!file.WriteInt(u)) break;

    ON_INTERNAL_OBSOLETE::V5_horizontal_alignment obsolete_leader_halign = ON_INTERNAL_OBSOLETE::V5HorizontalAlignmentFromV6HorizontalAlignment(m_leader_text_horizontal_alignment);
    u = static_cast<unsigned int>(obsolete_leader_halign);
    if (!file.WriteInt(u)) break;

    if (!file.WriteBool(m_draw_forward)) break;
    if (!file.WriteBool(m_signed_ordinate)) break;

    if (!m_scale_value.Write(file)) break;

    u = static_cast<unsigned int>(this->UnitSystem());
    if (!file.WriteInt(u)) break;

    // END chunk version 1.1 information

    // August 2016 added m_font_characteristics to archive.
    if (!m_font_characteristics.Write(file)) break;

    // END chunk version 1.2 information

    // October 2016 added m_text_mask
    if (!m_text_mask.Write(file)) break;

    // END chunk version 1.3 information

    // Feb 2017 added enum values
    u = static_cast<unsigned int>(m_dim_text_location);
    if (!file.WriteInt(u)) break;

    u = static_cast<unsigned int>(m_dimradial_text_location);
    if (!file.WriteInt(u)) break;

    u = static_cast<unsigned int>(m_text_vertical_alignment);
    if (!file.WriteInt(u)) break;

    u = static_cast<unsigned int>(m_text_horizontal_alignment);
    if (!file.WriteInt(u)) break;

    u = static_cast<unsigned int>(m_leader_text_vertical_alignment);
    if (!file.WriteInt(u)) break;

    u = static_cast<unsigned int>(m_leader_text_horizontal_alignment);
    if (!file.WriteInt(u)) break;

    u = static_cast<unsigned int>(m_text_orientation);
    if (!file.WriteInt(u)) break;

    u = static_cast<unsigned int>(m_leader_text_orientation);
    if (!file.WriteInt(u)) break;

    u = static_cast<unsigned int>(m_dim_text_orientation);
    if (!file.WriteInt(u)) break;

    u = static_cast<unsigned int>(m_dimradial_text_orientation);
    if (!file.WriteInt(u)) break;

    u = static_cast<unsigned int>(m_dim_text_angle_style);
    if (!file.WriteInt(u)) break;

    u = static_cast<unsigned int>(m_dimradial_text_angle_style);
    if (!file.WriteInt(u)) break;

    if (!file.WriteBool(m_text_underlined)) break;

    // END chunk version 1.4 information

    // June 16, 2017 chunk 1.5 information
    // added m_dimension_unitsystem and m_alt_dimension_unitsystem 
    u = static_cast<unsigned int>(dim_length_display_unit);
    if (!file.WriteInt(u)) break;

    u = static_cast<unsigned int>(alt_dim_length_display_unit);
    if (!file.WriteInt(u)) break;

    // END chunk version 1.5 information

    // June 29, 2017 chunk 1.6 added 
    // m_dimension_length_display and m_alternate_dimension_length_display
    u = static_cast<unsigned int>(m_dimension_length_display);
    if (!file.WriteInt(u)) break;
    u = static_cast<unsigned int>(m_alternate_dimension_length_display);
    if (!file.WriteInt(u)) break;
    // END chunk version 1.6 information

    u = static_cast<unsigned int>(m_centermark_style);
    if (!file.WriteInt(u)) break;
    // END chunk version 1.7 information

    if (!file.WriteBool(m_bForceDimLine)) break;

    u = static_cast<unsigned int>(m_TextFit);
    if (!file.WriteInt(u)) break;

    u = static_cast<unsigned int>(m_ArrowFit);
    if (!file.WriteInt(u)) break;
    // END chunk version 1.8 information

    u = static_cast<unsigned int>(m_decimal_separator);
    if (!file.WriteInt(u)) break;
    // END chunk version 1.9 information

    rc = true;
    break;
  }
  if (!file.EndWrite3dmChunk())
    rc = false;

  return rc;
}